

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_loopfilter.c
# Opt level: O0

void filter_horz_chroma(uint8_t *u_dst,uint8_t *v_dst,int dst_stride,
                       AV1_DEBLOCKING_PARAMETERS *params,SequenceHeader *seq_params,
                       USE_FILTER_TYPE use_filter_type)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint16_t *puVar4;
  uint16_t *puVar5;
  undefined1 *in_RCX;
  int in_EDX;
  uint8_t *unaff_RBX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  long in_R8;
  char in_R9B;
  uint8_t *unaff_retaddr;
  uint8_t *in_stack_00000008;
  undefined4 in_stack_00000010;
  int in_stack_00000014;
  uint16_t *in_stack_00000018;
  uchar *in_stack_00000020;
  undefined4 in_stack_00000028;
  int in_stack_0000002c;
  undefined4 in_stack_00000030;
  int in_stack_00000034;
  uint16_t *in_stack_00000038;
  int in_stack_00000044;
  uint16_t *v_dst_shortptr;
  uint16_t *u_dst_shortptr;
  aom_bit_depth_t bit_depth;
  int use_highbitdepth;
  loop_filter_thresh *v_limits;
  loop_filter_thresh *u_limits;
  undefined7 in_stack_00000070;
  undefined4 in_stack_00000088;
  uchar *in_stack_00000178;
  uchar *in_stack_00000180;
  uchar *in_stack_00000188;
  int in_stack_00000194;
  uchar *in_stack_00000198;
  uchar *in_stack_00000a20;
  uchar *in_stack_00000a28;
  uint8_t *in_stack_00000ef0;
  uint8_t *in_stack_00000ef8;
  int in_stack_00000f00;
  uchar *in_stack_000011f0;
  uchar *in_stack_000011f8;
  
  puVar2 = *(uint8_t **)(in_RCX + 8);
  puVar3 = *(uint8_t **)(in_RCX + 8);
  iVar1 = *(int *)(in_R8 + 0x48);
  if (*(char *)(in_R8 + 0x4c) == '\0') {
    if (in_R9B == '\x02') {
      switch(*in_RCX) {
      case 4:
        aom_lpf_horizontal_4_quad_sse2
                  (in_stack_00000198,in_stack_00000194,in_stack_00000188,in_stack_00000180,
                   in_stack_00000178);
        aom_lpf_horizontal_4_quad_sse2
                  (in_stack_00000198,in_stack_00000194,in_stack_00000188,in_stack_00000180,
                   in_stack_00000178);
        break;
      case 6:
        (*aom_lpf_horizontal_6_quad)(in_RDI,in_EDX,puVar2,puVar2 + 0x10,puVar2 + 0x20);
        (*aom_lpf_horizontal_6_quad)(in_RSI,in_EDX,puVar3,puVar3 + 0x10,puVar3 + 0x20);
        break;
      case 8:
      case 0xe:
      default:
      }
    }
    else if (in_R9B == '\x01') {
      switch(*in_RCX) {
      case 4:
        aom_lpf_horizontal_4_dual_sse2
                  ((uchar *)v_dst_shortptr,in_stack_00000044,(uchar *)in_stack_00000038,
                   (uchar *)CONCAT44(in_stack_00000034,in_stack_00000030),
                   (uchar *)CONCAT44(in_stack_0000002c,in_stack_00000028),in_stack_00000020,
                   in_stack_00000a20,in_stack_00000a28);
        aom_lpf_horizontal_4_dual_sse2
                  ((uchar *)v_dst_shortptr,in_stack_00000044,(uchar *)in_stack_00000038,
                   (uchar *)CONCAT44(in_stack_00000034,in_stack_00000030),
                   (uchar *)CONCAT44(in_stack_0000002c,in_stack_00000028),in_stack_00000020,
                   in_stack_00000a20,in_stack_00000a28);
        break;
      case 6:
        aom_lpf_horizontal_6_dual_sse2
                  ((uchar *)in_stack_00000038,in_stack_00000034,
                   (uchar *)CONCAT44(in_stack_0000002c,in_stack_00000028),in_stack_00000020,
                   (uchar *)in_stack_00000018,(uchar *)CONCAT44(in_stack_00000014,in_stack_00000010)
                   ,in_stack_000011f0,in_stack_000011f8);
        aom_lpf_horizontal_6_dual_sse2
                  ((uchar *)in_stack_00000038,in_stack_00000034,
                   (uchar *)CONCAT44(in_stack_0000002c,in_stack_00000028),in_stack_00000020,
                   (uchar *)in_stack_00000018,(uchar *)CONCAT44(in_stack_00000014,in_stack_00000010)
                   ,in_stack_000011f0,in_stack_000011f8);
        break;
      case 8:
      case 0xe:
      default:
      }
    }
    else {
      switch(*in_RCX) {
      case 4:
        aom_lpf_horizontal_4_sse2
                  ((uint8_t *)in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,
                   unaff_RBX);
        aom_lpf_horizontal_4_sse2
                  ((uint8_t *)in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,
                   unaff_RBX);
        break;
      default:
        break;
      case 6:
        aom_lpf_horizontal_6_sse2
                  ((uchar *)CONCAT44(in_stack_00000034,in_stack_00000030),in_stack_0000002c,
                   in_stack_00000020,(uchar *)in_stack_00000018,
                   (uchar *)CONCAT44(in_stack_00000014,in_stack_00000010));
        aom_lpf_horizontal_6_sse2
                  ((uchar *)CONCAT44(in_stack_00000034,in_stack_00000030),in_stack_0000002c,
                   in_stack_00000020,(uchar *)in_stack_00000018,
                   (uchar *)CONCAT44(in_stack_00000014,in_stack_00000010));
        break;
      case 8:
      case 0xe:
      }
    }
  }
  else {
    puVar4 = (uint16_t *)((long)in_RDI * 2);
    puVar5 = (uint16_t *)((long)in_RSI * 2);
    if (in_R9B == '\x02') {
      switch(*in_RCX) {
      case 4:
        (*aom_highbd_lpf_horizontal_4_dual)
                  (puVar4,in_EDX,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,puVar2 + 0x10,
                   puVar2 + 0x20,iVar1);
        (*aom_highbd_lpf_horizontal_4_dual)
                  (puVar4 + 8,in_EDX,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,puVar2 + 0x10,
                   puVar2 + 0x20,iVar1);
        (*aom_highbd_lpf_horizontal_4_dual)
                  (puVar5,in_EDX,puVar3,puVar3 + 0x10,puVar3 + 0x20,puVar3,puVar3 + 0x10,
                   puVar3 + 0x20,iVar1);
        (*aom_highbd_lpf_horizontal_4_dual)
                  (puVar5 + 8,in_EDX,puVar3,puVar3 + 0x10,puVar3 + 0x20,puVar3,puVar3 + 0x10,
                   puVar3 + 0x20,iVar1);
        break;
      case 6:
        aom_highbd_lpf_horizontal_6_dual_sse2
                  (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,unaff_RBX,
                   in_RDI,in_stack_00000ef0,in_stack_00000ef8,in_stack_00000f00);
        aom_highbd_lpf_horizontal_6_dual_sse2
                  (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,unaff_RBX,
                   in_RDI,in_stack_00000ef0,in_stack_00000ef8,in_stack_00000f00);
        aom_highbd_lpf_horizontal_6_dual_sse2
                  (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,unaff_RBX,
                   in_RDI,in_stack_00000ef0,in_stack_00000ef8,in_stack_00000f00);
        aom_highbd_lpf_horizontal_6_dual_sse2
                  (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,unaff_RBX,
                   in_RDI,in_stack_00000ef0,in_stack_00000ef8,in_stack_00000f00);
        break;
      case 8:
      case 0xe:
      default:
      }
    }
    else if (in_R9B == '\x01') {
      switch(*in_RCX) {
      case 4:
        (*aom_highbd_lpf_horizontal_4_dual)
                  (puVar4,in_EDX,puVar2,puVar2 + 0x10,puVar2 + 0x20,puVar2,puVar2 + 0x10,
                   puVar2 + 0x20,iVar1);
        (*aom_highbd_lpf_horizontal_4_dual)
                  (puVar5,in_EDX,puVar3,puVar3 + 0x10,puVar3 + 0x20,puVar3,puVar3 + 0x10,
                   puVar3 + 0x20,iVar1);
        break;
      case 6:
        aom_highbd_lpf_horizontal_6_dual_sse2
                  (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,unaff_RBX,
                   in_RDI,in_stack_00000ef0,in_stack_00000ef8,in_stack_00000f00);
        aom_highbd_lpf_horizontal_6_dual_sse2
                  (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,unaff_RBX,
                   in_RDI,in_stack_00000ef0,in_stack_00000ef8,in_stack_00000f00);
        break;
      case 8:
      case 0xe:
      default:
      }
    }
    else {
      switch(*in_RCX) {
      case 4:
        aom_highbd_lpf_horizontal_4_sse2
                  (in_stack_00000038,in_stack_00000034,
                   (uint8_t *)CONCAT44(in_stack_0000002c,in_stack_00000028),in_stack_00000020,
                   (uint8_t *)in_stack_00000018,in_stack_00000014);
        aom_highbd_lpf_horizontal_4_sse2
                  (in_stack_00000038,in_stack_00000034,
                   (uint8_t *)CONCAT44(in_stack_0000002c,in_stack_00000028),in_stack_00000020,
                   (uint8_t *)in_stack_00000018,in_stack_00000014);
        break;
      default:
        break;
      case 6:
        aom_highbd_lpf_horizontal_6_sse2
                  ((uint16_t *)CONCAT44(dst_stride,in_stack_00000088),params._4_4_,
                   (uint8_t *)seq_params,(uint8_t *)CONCAT17(use_filter_type,in_stack_00000070),
                   u_limits->mblim,v_limits._4_4_);
        aom_highbd_lpf_horizontal_6_sse2
                  ((uint16_t *)CONCAT44(dst_stride,in_stack_00000088),params._4_4_,
                   (uint8_t *)seq_params,(uint8_t *)CONCAT17(use_filter_type,in_stack_00000070),
                   u_limits->mblim,v_limits._4_4_);
        break;
      case 8:
      case 0xe:
      }
    }
  }
  return;
}

Assistant:

static inline void filter_horz_chroma(uint8_t *u_dst, uint8_t *v_dst,
                                      int dst_stride,
                                      const AV1_DEBLOCKING_PARAMETERS *params,
                                      const SequenceHeader *seq_params,
                                      USE_FILTER_TYPE use_filter_type) {
  const loop_filter_thresh *u_limits = params->lfthr;
  const loop_filter_thresh *v_limits = params->lfthr;
#if CONFIG_AV1_HIGHBITDEPTH
  const int use_highbitdepth = seq_params->use_highbitdepth;
  const aom_bit_depth_t bit_depth = seq_params->bit_depth;
  if (use_highbitdepth) {
    uint16_t *u_dst_shortptr = CONVERT_TO_SHORTPTR(u_dst);
    uint16_t *v_dst_shortptr = CONVERT_TO_SHORTPTR(v_dst);
    if (use_filter_type == USE_QUAD) {
      switch (params->filter_length) {
        // apply 4-tap filtering
        case 4:
          aom_highbd_lpf_horizontal_4_dual(
              u_dst_shortptr, dst_stride, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, bit_depth);
          aom_highbd_lpf_horizontal_4_dual(
              u_dst_shortptr + (2 * MI_SIZE), dst_stride, u_limits->mblim,
              u_limits->lim, u_limits->hev_thr, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, bit_depth);
          aom_highbd_lpf_horizontal_4_dual(
              v_dst_shortptr, dst_stride, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, bit_depth);
          aom_highbd_lpf_horizontal_4_dual(
              v_dst_shortptr + (2 * MI_SIZE), dst_stride, v_limits->mblim,
              v_limits->lim, v_limits->hev_thr, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, bit_depth);
          break;
        case 6:  // apply 6-tap filter for chroma plane only
          aom_highbd_lpf_horizontal_6_dual(
              u_dst_shortptr, dst_stride, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, bit_depth);
          aom_highbd_lpf_horizontal_6_dual(
              u_dst_shortptr + (2 * MI_SIZE), dst_stride, u_limits->mblim,
              u_limits->lim, u_limits->hev_thr, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, bit_depth);
          aom_highbd_lpf_horizontal_6_dual(
              v_dst_shortptr, dst_stride, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, bit_depth);
          aom_highbd_lpf_horizontal_6_dual(
              v_dst_shortptr + (2 * MI_SIZE), dst_stride, v_limits->mblim,
              v_limits->lim, v_limits->hev_thr, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, bit_depth);
          break;
        case 8:
        case 14: assert(0);
        // no filtering
        default: break;
      }
    } else if (use_filter_type == USE_DUAL) {
      switch (params->filter_length) {
        // apply 4-tap filtering
        case 4:
          aom_highbd_lpf_horizontal_4_dual(
              u_dst_shortptr, dst_stride, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, bit_depth);
          aom_highbd_lpf_horizontal_4_dual(
              v_dst_shortptr, dst_stride, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, bit_depth);
          break;
        case 6:  // apply 6-tap filter for chroma plane only
          aom_highbd_lpf_horizontal_6_dual(
              u_dst_shortptr, dst_stride, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, u_limits->mblim, u_limits->lim,
              u_limits->hev_thr, bit_depth);
          aom_highbd_lpf_horizontal_6_dual(
              v_dst_shortptr, dst_stride, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, v_limits->mblim, v_limits->lim,
              v_limits->hev_thr, bit_depth);
          break;
        case 8:
        case 14: assert(0);
        // no filtering
        default: break;
      }
    } else {
      assert(use_filter_type == USE_SINGLE);
      switch (params->filter_length) {
        // apply 4-tap filtering
        case 4:
          aom_highbd_lpf_horizontal_4(u_dst_shortptr, dst_stride,
                                      u_limits->mblim, u_limits->lim,
                                      u_limits->hev_thr, bit_depth);
          aom_highbd_lpf_horizontal_4(v_dst_shortptr, dst_stride,
                                      v_limits->mblim, v_limits->lim,
                                      v_limits->hev_thr, bit_depth);
          break;
        case 6:  // apply 6-tap filter for chroma plane only
          aom_highbd_lpf_horizontal_6(u_dst_shortptr, dst_stride,
                                      u_limits->mblim, u_limits->lim,
                                      u_limits->hev_thr, bit_depth);
          aom_highbd_lpf_horizontal_6(v_dst_shortptr, dst_stride,
                                      v_limits->mblim, v_limits->lim,
                                      v_limits->hev_thr, bit_depth);
          break;
        case 8:
        case 14: assert(0); break;
        // no filtering
        default: break;
      }
    }
    return;
  }
#endif  // CONFIG_AV1_HIGHBITDEPTH
  if (use_filter_type == USE_QUAD) {
    // Only one set of loop filter parameters (mblim, lim and hev_thr) is
    // passed as argument to quad loop filter because quad loop filter is
    // called for those cases where all the 4 set of loop filter parameters
    // are equal.
    switch (params->filter_length) {
      // apply 4-tap filtering
      case 4:
        aom_lpf_horizontal_4_quad(u_dst, dst_stride, u_limits->mblim,
                                  u_limits->lim, u_limits->hev_thr);
        aom_lpf_horizontal_4_quad(v_dst, dst_stride, v_limits->mblim,
                                  v_limits->lim, v_limits->hev_thr);
        break;
      case 6:  // apply 6-tap filter for chroma plane only
        aom_lpf_horizontal_6_quad(u_dst, dst_stride, u_limits->mblim,
                                  u_limits->lim, u_limits->hev_thr);
        aom_lpf_horizontal_6_quad(v_dst, dst_stride, v_limits->mblim,
                                  v_limits->lim, v_limits->hev_thr);
        break;
      case 8:
      case 14: assert(0);
      // no filtering
      default: break;
    }
  } else if (use_filter_type == USE_DUAL) {
    switch (params->filter_length) {
      // apply 4-tap filtering
      case 4:
        aom_lpf_horizontal_4_dual(u_dst, dst_stride, u_limits->mblim,
                                  u_limits->lim, u_limits->hev_thr,
                                  u_limits->mblim, u_limits->lim,
                                  u_limits->hev_thr);
        aom_lpf_horizontal_4_dual(v_dst, dst_stride, v_limits->mblim,
                                  v_limits->lim, v_limits->hev_thr,
                                  v_limits->mblim, v_limits->lim,
                                  v_limits->hev_thr);
        break;
      case 6:  // apply 6-tap filter for chroma plane only
        aom_lpf_horizontal_6_dual(u_dst, dst_stride, u_limits->mblim,
                                  u_limits->lim, u_limits->hev_thr,
                                  u_limits->mblim, u_limits->lim,
                                  u_limits->hev_thr);
        aom_lpf_horizontal_6_dual(v_dst, dst_stride, v_limits->mblim,
                                  v_limits->lim, v_limits->hev_thr,
                                  v_limits->mblim, v_limits->lim,
                                  v_limits->hev_thr);
        break;
      case 8:
      case 14: assert(0);
      // no filtering
      default: break;
    }
  } else {
    assert(use_filter_type == USE_SINGLE);
    switch (params->filter_length) {
      // apply 4-tap filtering
      case 4:
        aom_lpf_horizontal_4(u_dst, dst_stride, u_limits->mblim, u_limits->lim,
                             u_limits->hev_thr);
        aom_lpf_horizontal_4(v_dst, dst_stride, v_limits->mblim, v_limits->lim,
                             u_limits->hev_thr);
        break;
      case 6:  // apply 6-tap filter for chroma plane only
        aom_lpf_horizontal_6(u_dst, dst_stride, u_limits->mblim, u_limits->lim,
                             u_limits->hev_thr);
        aom_lpf_horizontal_6(v_dst, dst_stride, v_limits->mblim, v_limits->lim,
                             v_limits->hev_thr);
        break;
      case 8:
      case 14: assert(0); break;
      // no filtering
      default: break;
    }
  }
#if !CONFIG_AV1_HIGHBITDEPTH
  (void)seq_params;
#endif  // !CONFIG_AV1_HIGHBITDEPTH
}